

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O1

REF_STATUS ref_face_make_canonical(REF_INT *original,REF_INT *canonical)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = ref_sort_insertion_int(4,original,canonical);
  if (uVar3 == 0) {
    iVar1 = *canonical;
    iVar2 = canonical[1];
    if (iVar1 != iVar2) {
      if (iVar2 != canonical[2]) {
        if (canonical[2] != canonical[3]) {
          return 0;
        }
        canonical[2] = iVar2;
        canonical[1] = iVar1;
        *canonical = -1;
        return 0;
      }
      canonical[1] = iVar1;
    }
    *canonical = -1;
    uVar3 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x6b,
           "ref_face_make_canonical",(ulong)uVar3,"sort");
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_face_make_canonical(REF_INT *original,
                                                  REF_INT *canonical) {
  RSS(ref_sort_insertion_int(4, original, canonical), "sort");

  if (canonical[0] == canonical[1]) {
    canonical[0] = REF_EMPTY;
    return REF_SUCCESS;
  }

  if (canonical[1] == canonical[2]) {
    canonical[1] = canonical[0];
    canonical[0] = REF_EMPTY;
    return REF_SUCCESS;
  }

  if (canonical[2] == canonical[3]) {
    canonical[2] = canonical[1];
    canonical[1] = canonical[0];
    canonical[0] = REF_EMPTY;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}